

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O3

char_type * __thiscall
booster::locale::gnu_gettext::mo_message<char>::get
          (mo_message<char> *this,int domain_id,char_type *context,char_type *single_id,int n)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  pair_type pVar9;
  undefined4 local_2c;
  
  pVar9 = get_string(this,domain_id,context,single_id);
  pcVar7 = pVar9.second;
  pcVar6 = pVar9.first;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    psVar1 = (this->plural_forms_).
             super__Vector_base<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->plural_forms_).
                      super__Vector_base<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::lambda::plural>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <=
        (ulong)(long)domain_id) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    peVar2 = psVar1[domain_id].
             super___shared_ptr<booster::locale::gnu_gettext::lambda::plural,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      uVar5 = (uint)(n != 1);
    }
    else {
      uVar5 = (**peVar2->_vptr_plural)(peVar2,(ulong)(uint)n);
    }
    bVar3 = true;
    if ((pcVar6 < pcVar7) && (0 < (int)uVar5)) {
      iVar8 = 1;
      do {
        local_2c = 0;
        pcVar6 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                           (pcVar6,pcVar7,&local_2c);
        bVar3 = pcVar6 != pcVar7;
        if ((pcVar6 == pcVar7) || (pcVar6 = pcVar6 + 1, pcVar7 <= pcVar6)) break;
        bVar4 = iVar8 < (int)uVar5;
        iVar8 = iVar8 + 1;
      } while (bVar4);
    }
    if (pcVar7 <= pcVar6) {
      pcVar6 = (char *)0x0;
    }
    if (!bVar3) {
      pcVar6 = (char *)0x0;
    }
  }
  return pcVar6;
}

Assistant:

virtual char_type const *get(int domain_id,char_type const *context,char_type const *single_id,int n) const
                {
                    pair_type ptr = get_string(domain_id,context,single_id);
                    if(!ptr.first)
                        return 0;
                    int form=0;
                    if(plural_forms_.at(domain_id)) 
                        form = (*plural_forms_[domain_id])(n);
                    else
                        form = n == 1 ? 0 : 1; // Fallback to english plural form

                    CharType const *p=ptr.first;
                    for(int i=0;p < ptr.second && i<form;i++) {
                        p=std::find(p,ptr.second,0);
                        if(p==ptr.second)
                            return 0;
                        ++p;
                    }
                    if(p>=ptr.second)
                        return 0;
                    return p;
                }